

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::LengthOfComputeResultTest::prepareUniforms
          (LengthOfComputeResultTest *this,program *program)

{
  Utils::program::uniform(program,"gohan",FLOAT,4,3,prepareUniforms::gohan_data);
  Utils::program::uniform(program,"goten",FLOAT,2,4,prepareUniforms::goten_data);
  Utils::program::uniform(program,"vegeta",FLOAT,1,3,prepareUniforms::vegeta_data);
  Utils::program::uniform(program,"trunks",FLOAT,1,3,prepareUniforms::trunks_data);
  Utils::program::uniform(program,"indices",UINT,1,4,prepareUniforms::indices_data);
  Utils::program::uniform(program,"variable",UINT,1,1,prepareUniforms::variable_data);
  Utils::program::uniform
            (program,"expected_lengths",UINT,1,4,prepareUniforms::expected_lengths_data);
  Utils::program::uniform(program,"expected_sum",FLOAT,1,1,prepareUniforms::expected_sum_data);
  return;
}

Assistant:

void LengthOfComputeResultTest::prepareUniforms(Utils::program& program)
{
	static const GLfloat gohan_data[12] = { 0.125f, 0.125f, 0.125f, 0.125f, 0.125f, 0.125f,
											0.125f, 0.125f, 0.125f, 0.125f, 0.125f, 0.125f };

	static const GLfloat goten_data[8] = { 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f, 1.0f };

	static const GLfloat vegeta_data[3] = { 0.5f, 0.5f, 0.0f };

	static const GLfloat trunks_data[3] = { 0.5f, 0.5f, 0.0f };

	static const GLuint indices_data[4] = { 2, 1, 0, 3 };

	static const GLuint variable_data[1] = { 1 };

	static const GLuint expected_lengths_data[4] = { 3, 2, 3, 3 };

	static const GLfloat expected_sum_data[1] = { 1.0f };

	program.uniform("gohan", Utils::FLOAT, 4 /* n_cols */, 3 /* n_rows */, gohan_data);
	program.uniform("goten", Utils::FLOAT, 2 /* n_cols */, 4 /* n_rows */, goten_data);
	program.uniform("vegeta", Utils::FLOAT, 1 /* n_cols */, 3 /* n_rows */, vegeta_data);
	program.uniform("trunks", Utils::FLOAT, 1 /* n_cols */, 3 /* n_rows */, trunks_data);
	program.uniform("indices", Utils::UINT, 1 /* n_cols */, 4 /* n_rows */, indices_data);
	program.uniform("variable", Utils::UINT, 1 /* n_cols */, 1 /* n_rows */, variable_data);
	program.uniform("expected_lengths", Utils::UINT, 1 /* n_cols */, 4 /* n_rows */, expected_lengths_data);
	program.uniform("expected_sum", Utils::FLOAT, 1 /* n_cols */, 1 /* n_rows */, expected_sum_data);
}